

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_cfb.c
# Opt level: O3

void beltCFBStepD(void *buf,size_t count,void *state)

{
  size_t *psVar1;
  octet *block;
  ulong uVar2;
  size_t sVar3;
  
  psVar1 = (size_t *)((long)state + 0x30);
  uVar2 = *(ulong *)((long)state + 0x30);
  if (uVar2 != 0) {
    if (count <= uVar2) {
      memXor2(buf,(void *)((long)psVar1 - uVar2),count);
      memXor2((void *)((long)psVar1 - *psVar1),buf,count);
      sVar3 = *psVar1;
      goto LAB_0012e65d;
    }
    memXor2(buf,(void *)((long)psVar1 - uVar2),uVar2);
    memXor2((void *)((long)psVar1 - *psVar1),buf,*psVar1);
    count = count - *psVar1;
    buf = (void *)((long)buf + *psVar1);
    *psVar1 = 0;
  }
  if (0xf < count) {
    do {
      beltBlockEncr((octet *)((long)state + 0x20),(u32 *)state);
      uVar2 = *buf ^ *(ulong *)((long)state + 0x20);
      *(ulong *)buf = uVar2;
      *(ulong *)((long)buf + 8) = *(ulong *)((long)buf + 8) ^ *(ulong *)((long)state + 0x28);
      *(ulong *)((long)state + 0x20) = *(ulong *)((long)state + 0x20) ^ uVar2;
      *(ulong *)((long)state + 0x28) = *(ulong *)((long)state + 0x28) ^ *(ulong *)((long)buf + 8);
      buf = (void *)((long)buf + 0x10);
      count = count - 0x10;
    } while (0xf < count);
  }
  if (count == 0) {
    return;
  }
  block = (octet *)((long)state + 0x20);
  beltBlockEncr(block,(u32 *)state);
  memXor2(buf,block,count);
  memXor2(block,buf,count);
  sVar3 = 0x10;
LAB_0012e65d:
  *psVar1 = sVar3 - count;
  return;
}

Assistant:

void beltCFBStepD(void* buf, size_t count, void* state)
{
	belt_cfb_st* st = (belt_cfb_st*)state;
	ASSERT(memIsDisjoint2(buf, count, state, beltCFB_keep()));
	// есть резерв гаммы?
	if (st->reserved)
	{
		if (st->reserved >= count)
		{
			memXor2(buf, st->block + 16 - st->reserved, count);
			memXor2(st->block + 16 - st->reserved, buf, count);
			st->reserved -= count;
			return;
		}
		memXor2(buf, st->block + 16 - st->reserved, st->reserved);
		memXor2(st->block + 16 - st->reserved, buf, st->reserved);
		count -= st->reserved;
		buf = (octet*)buf + st->reserved;
		st->reserved = 0;
	}
	// цикл по полным блокам
	while (count >= 16)
	{
		beltBlockEncr(st->block, st->key);
		beltBlockXor2(buf, st->block);
		beltBlockXor2(st->block, buf);
		buf = (octet*)buf + 16;
		count -= 16;
	}
	// неполный блок?
	if (count)
	{
		beltBlockEncr(st->block, st->key);
		memXor2(buf, st->block, count);
		memXor2(st->block, buf, count);
		st->reserved = 16 - count;
	}
}